

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegExpConstructor.cpp
# Opt level: O2

PropertyQueryFlags __thiscall
Js::JavascriptRegExpConstructor::HasPropertyQuery
          (JavascriptRegExpConstructor *this,PropertyId propertyId,PropertyValueInfo *info)

{
  PropertyQueryFlags PVar1;
  
  if ((propertyId - 0x1d0U < 0x17) && ((0x78ffffU >> (propertyId - 0x1d0U & 0x1f) & 1) != 0)) {
    return Property_Found;
  }
  PVar1 = JavascriptFunction::HasPropertyQuery((JavascriptFunction *)this,propertyId,info);
  return PVar1;
}

Assistant:

PropertyQueryFlags JavascriptRegExpConstructor::HasPropertyQuery(PropertyId propertyId, _Inout_opt_ PropertyValueInfo* info)
    {
        switch (propertyId)
        {
        case PropertyIds::lastMatch:
        case PropertyIds::$Ampersand:
        case PropertyIds::lastParen:
        case PropertyIds::$Plus:
        case PropertyIds::leftContext:
        case PropertyIds::$BackTick:
        case PropertyIds::rightContext:
        case PropertyIds::$Tick:
        case PropertyIds::index:
        case PropertyIds::input:
        case PropertyIds::$_:
        case PropertyIds::$1:
        case PropertyIds::$2:
        case PropertyIds::$3:
        case PropertyIds::$4:
        case PropertyIds::$5:
        case PropertyIds::$6:
        case PropertyIds::$7:
        case PropertyIds::$8:
        case PropertyIds::$9:
            return PropertyQueryFlags::Property_Found;
        default:
            return JavascriptFunction::HasPropertyQuery(propertyId, info);
        }
    }